

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::getNumTessellatedPrimitives
          (FeedbackPrimitiveTypeCase *this)

{
  TessellationOutputType TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (this->m_tessellationPointMode == TESSELLATION_POINTMODE_ON) {
    TVar1 = this->m_tessellationOutput;
    if (TVar1 == TESSELLATION_OUT_ISOLINES) {
      return 0xc;
    }
    if (TVar1 == TESSELLATION_OUT_QUADS) {
      return 0x10;
    }
    if (TVar1 == TESSELLATION_OUT_TRIANGLES) {
      iVar2 = 3;
      iVar4 = 9;
      iVar3 = 0;
      do {
        if (iVar2 == 0) {
          iVar2 = 1;
LAB_0131d116:
          return iVar2 + iVar3;
        }
        if (iVar2 == 1) {
          iVar2 = 3;
          goto LAB_0131d116;
        }
        iVar2 = iVar2 + -2;
        iVar3 = iVar3 + iVar4;
        iVar4 = iVar4 + -6;
      } while( true );
    }
  }
  else if ((this->m_tessellationPointMode == TESSELLATION_POINTMODE_OFF) &&
          ((ulong)this->m_tessellationOutput < 3)) {
    return *(int *)(&DAT_018ca8d8 + (ulong)this->m_tessellationOutput * 4);
  }
  return -1;
}

Assistant:

int FeedbackPrimitiveTypeCase::getNumTessellatedPrimitives (void) const
{
	const int tessellationLevel = 3;

	if (m_tessellationPointMode == TESSELLATION_POINTMODE_OFF)
	{
		if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
			return getTriangleNumOutputPrimitives(tessellationLevel);
		else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
			return tessellationLevel * tessellationLevel * 2; // tessellated as triangles
		else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
			return tessellationLevel * tessellationLevel;
	}
	else if (m_tessellationPointMode == TESSELLATION_POINTMODE_ON)
	{
		if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
			return getTriangleNumOutputPrimitivesPoints(tessellationLevel);
		else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
			return (tessellationLevel + 1) * (tessellationLevel + 1);
		else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
			return tessellationLevel * (tessellationLevel + 1);
	}

	DE_ASSERT(false);
	return -1;
}